

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

double __thiscall sophia_interface::twoback(sophia_interface *this,double x)

{
  double dVar1;
  double x_local;
  sophia_interface *this_local;
  
  dVar1 = Pl(this,x,0.4,0.6,2.0);
  return dVar1 * 37.7;
}

Assistant:

double sophia_interface::twoback(double x) {
// TWO PION PRODUCTION
    return 37.7 * Pl(x, 0.4, 0.6, 2.);
}